

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

websocket_result * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::websocket_result>::awaitResume
          (LazyAwaiterBase<cinatra::websocket_result> *this)

{
  websocket_result *__src;
  coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::websocket_result>_> *in_RSI;
  websocket_result *in_RDI;
  websocket_result r;
  undefined1 local_38 [8];
  LazyPromise<cinatra::websocket_result> *in_stack_ffffffffffffffd0;
  
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::websocket_result>_>::
  promise(in_RSI);
  __src = LazyPromise<cinatra::websocket_result>::result(in_stack_ffffffffffffffd0);
  memcpy(local_38,__src,0x30);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::websocket_result>_>::
  destroy((coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::websocket_result>_> *)
          0x431746);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::websocket_result>_>::
  operator=(in_RSI,(nullptr_t)0x0);
  memcpy(in_RDI,local_38,0x30);
  return in_RDI;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }